

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

ZSTDMT_jobDescription * ZSTDMT_createJobsTable(U32 *nbJobsPtr,ZSTD_customMem cMem)

{
  int iVar1;
  ZSTD_customMem cMem_00;
  uint uVar2;
  uint uVar3;
  undefined8 in_RAX;
  ZSTDMT_jobDescription *jobTable;
  uint nbJobs;
  undefined8 unaff_RBX;
  uint uVar4;
  void *unaff_R12;
  size_t __size;
  ulong uVar5;
  pthread_cond_t *__cond;
  
  iVar1 = 0x1f;
  if (*nbJobsPtr != 0) {
    for (; *nbJobsPtr >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  nbJobs = 2 << ((byte)iVar1 & 0x1f);
  __size = 0x1b8L << (-(((byte)iVar1 ^ 0x1f) + 0x20) & 0x3f);
  if (cMem.customAlloc == (ZSTD_allocFunction)0x0) {
    jobTable = (ZSTDMT_jobDescription *)calloc(1,__size);
  }
  else {
    jobTable = (ZSTDMT_jobDescription *)(*cMem.customAlloc)(cMem.opaque,__size);
    memset(jobTable,0,__size);
  }
  uVar4 = 0;
  if (jobTable != (ZSTDMT_jobDescription *)0x0) {
    *nbJobsPtr = nbJobs;
    uVar5 = (ulong)nbJobs;
    __cond = (pthread_cond_t *)&jobTable->job_cond;
    do {
      uVar2 = pthread_mutex_init((pthread_mutex_t *)((long)__cond + -0x28),
                                 (pthread_mutexattr_t *)0x0);
      uVar3 = pthread_cond_init(__cond,(pthread_condattr_t *)0x0);
      uVar4 = uVar4 | uVar2 | uVar3;
      __cond = (pthread_cond_t *)((long)__cond + 0x1b8);
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    if (uVar4 == 0) {
      return jobTable;
    }
    cMem_00.customFree = (ZSTD_freeFunction)unaff_RBX;
    cMem_00.customAlloc = (ZSTD_allocFunction)in_RAX;
    cMem_00.opaque = unaff_R12;
    ZSTDMT_freeJobsTable(jobTable,nbJobs,cMem_00);
  }
  return (ZSTDMT_jobDescription *)0x0;
}

Assistant:

static ZSTDMT_jobDescription* ZSTDMT_createJobsTable(U32* nbJobsPtr, ZSTD_customMem cMem)
{
    U32 const nbJobsLog2 = ZSTD_highbit32(*nbJobsPtr) + 1;
    U32 const nbJobs = 1 << nbJobsLog2;
    U32 jobNb;
    ZSTDMT_jobDescription* const jobTable = (ZSTDMT_jobDescription*)
                ZSTD_customCalloc(nbJobs * sizeof(ZSTDMT_jobDescription), cMem);
    int initError = 0;
    if (jobTable==NULL) return NULL;
    *nbJobsPtr = nbJobs;
    for (jobNb=0; jobNb<nbJobs; jobNb++) {
        initError |= ZSTD_pthread_mutex_init(&jobTable[jobNb].job_mutex, NULL);
        initError |= ZSTD_pthread_cond_init(&jobTable[jobNb].job_cond, NULL);
    }
    if (initError != 0) {
        ZSTDMT_freeJobsTable(jobTable, nbJobs, cMem);
        return NULL;
    }
    return jobTable;
}